

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

bool __thiscall
QMimeBinaryProvider::matchSuffixTree
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,
          int numEntries,int firstOffset,QString *fileName,qsizetype charPos,bool caseSensitiveCheck
          )

{
  char16_t cVar1;
  uint uVar2;
  char16_t *pcVar3;
  uchar *puVar4;
  bool bVar5;
  CutResult CVar6;
  QString *pQVar7;
  int iVar8;
  long lVar10;
  uchar *puVar11;
  char16_t cVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  QString *this_00;
  ulong uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  uint local_108;
  QStringBuilder<char16_t,_QStringView> local_a0;
  QString local_88;
  QString local_68;
  qsizetype local_48;
  ulong local_40;
  long local_38;
  ulong uVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (fileName->d).ptr;
  cVar1 = pcVar3[charPos];
  iVar8 = numEntries + -1;
  iVar14 = 0;
  local_108 = (uint)pcVar3;
  do {
    if (iVar8 < iVar14) {
      local_108._0_1_ = 0;
      break;
    }
    uVar13 = (uint)(iVar14 + iVar8) >> 1;
    puVar4 = cacheFile->data;
    lVar10 = (long)(int)(firstOffset + uVar13 * 0xc);
    cVar12 = (ushort)(byte)((uint)*(undefined4 *)(puVar4 + lVar10) >> 0x18) |
             (ushort)((uint)*(undefined4 *)(puVar4 + lVar10) >> 8) & 0xff00;
    uVar18 = charPos;
    if ((ushort)cVar12 < (ushort)cVar1) {
      iVar14 = uVar13 + 1;
      bVar5 = true;
    }
    else if ((ushort)cVar1 < (ushort)cVar12) {
      iVar8 = uVar13 - 1;
      bVar5 = true;
    }
    else {
      uVar18 = charPos - 1;
      uVar13 = *(uint *)(puVar4 + lVar10 + 4);
      uVar16 = *(uint *)(puVar4 + lVar10 + 8);
      uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      if (charPos < 2) {
        local_108 = 0;
      }
      else {
        bVar5 = matchSuffixTree(this,result,cacheFile,uVar13,uVar16,fileName,uVar18,
                                caseSensitiveCheck);
        local_108 = (uint)bVar5;
      }
      if ((0 < (int)uVar13) && ((byte)local_108 == '\0')) {
        uVar17 = 0;
        do {
          lVar10 = (long)(int)uVar16 + uVar17 * 0xc;
          puVar4 = cacheFile->data;
          iVar15 = 4;
          if (*(int *)(puVar4 + lVar10) == 0) {
            uVar2 = *(uint *)(puVar4 + lVar10 + 4);
            ba.m_data._0_4_ =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            puVar11 = puVar4 + (int)(uint)ba.m_data;
            if (puVar4 == (uchar *)0x0) {
              this_00 = (QString *)0x0;
            }
            else {
              pQVar7 = (QString *)0xffffffffffffffff;
              do {
                this_00 = (QString *)((long)&(pQVar7->d).d + 1);
                puVar4 = puVar11 + 1 + (long)pQVar7;
                pQVar7 = this_00;
              } while (*puVar4 != '\0');
            }
            ba.m_size = (qsizetype)puVar11;
            ba.m_data._4_4_ = 0;
            uVar9 = (ulong)(uint)ba.m_data;
            QString::fromLatin1(&local_68,this_00,ba);
            local_88.d.d = local_68.d.d;
            local_88.d.ptr = local_68.d.ptr;
            local_88.d.size = local_68.d.size;
            bVar5 = QMimeProviderBase::isMimeTypeGlobsExcluded
                              (&this->super_QMimeProviderBase,&local_88);
            if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
              }
            }
            iVar15 = 6;
            if (!bVar5) {
              uVar2 = *(uint *)(cacheFile->data + lVar10 + 8);
              ba_00.m_data = (storage_type *)(CONCAT71((int7)(uVar9 >> 8),caseSensitiveCheck) ^ 1);
              iVar15 = 0;
              if ((byte)((byte)(uVar2 >> 0x10) & (byte)ba_00.m_data) == 0) {
                ba_00.m_size = (qsizetype)puVar11;
                QString::fromLatin1(&local_68,this_00,ba_00);
                local_88.d.d = local_68.d.d;
                local_88.d.ptr = local_68.d.ptr;
                local_88.d.size = local_68.d.size;
                pcVar3 = (fileName->d).ptr;
                local_48 = -1;
                local_40 = charPos;
                CVar6 = QtPrivate::QContainerImplHelper::mid
                                  ((fileName->d).size,(qsizetype *)&local_40,&local_48);
                if (CVar6 == Null) {
                  local_a0.b.m_size = 0;
                  local_a0.b.m_data = (char16_t *)0x0;
                }
                else {
                  local_a0.b.m_data = pcVar3 + local_40;
                  local_a0.b.m_size = local_48;
                }
                local_a0.a = L'*';
                QStringBuilder<char16_t,_QStringView>::convertTo<QString>(&local_68,&local_a0);
                QMimeGlobMatchResult::addMatch
                          (result,&local_88,uVar2 >> 0x18,&local_68,(fileName->d).size + ~charPos);
                if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
                  }
                }
                local_108 = 1;
                iVar15 = 0;
              }
            }
          }
        } while (((iVar15 == 6) || (iVar15 == 0)) && (uVar17 = uVar17 + 1, uVar17 != uVar13));
      }
      bVar5 = false;
    }
    charPos = uVar18;
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)((byte)local_108 & 1);
}

Assistant:

bool QMimeBinaryProvider::matchSuffixTree(QMimeGlobMatchResult &result,
                                          QMimeBinaryProvider::CacheFile *cacheFile, int numEntries,
                                          int firstOffset, const QString &fileName,
                                          qsizetype charPos, bool caseSensitiveCheck)
{
    QChar fileChar = fileName[charPos];
    int min = 0;
    int max = numEntries - 1;
    while (min <= max) {
        const int mid = (min + max) / 2;
        const int off = firstOffset + 12 * mid;
        const QChar ch = char16_t(cacheFile->getUint32(off));
        if (ch < fileChar)
            min = mid + 1;
        else if (ch > fileChar)
            max = mid - 1;
        else {
            --charPos;
            int numChildren = cacheFile->getUint32(off + 4);
            int childrenOffset = cacheFile->getUint32(off + 8);
            bool success = false;
            if (charPos > 0)
                success = matchSuffixTree(result, cacheFile, numChildren, childrenOffset, fileName, charPos, caseSensitiveCheck);
            if (!success) {
                for (int i = 0; i < numChildren; ++i) {
                    const int childOff = childrenOffset + 12 * i;
                    const int mch = cacheFile->getUint32(childOff);
                    if (mch != 0)
                        break;
                    const int mimeTypeOffset = cacheFile->getUint32(childOff + 4);
                    const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
                    if (isMimeTypeGlobsExcluded(mimeType))
                        continue;
                    const int flagsAndWeight = cacheFile->getUint32(childOff + 8);
                    const int weight = flagsAndWeight & 0xff;
                    const bool caseSensitive = flagsAndWeight & 0x100;
                    if (caseSensitiveCheck || !caseSensitive) {
                        result.addMatch(mimeType, weight,
                                        u'*' + QStringView{ fileName }.mid(charPos + 1),
                                        fileName.size() - charPos - 2);
                        success = true;
                    }
                }
            }
            return success;
        }
    }
    return false;
}